

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O0

void ZSTD_fillDoubleHashTable(ZSTD_matchState_t *ms,void *end,ZSTD_dictTableLoadMethod_e dtlm)

{
  U32 hBits;
  U32 mls_00;
  U32 hBits_00;
  U32 *pUVar1;
  U32 *pUVar2;
  BYTE *pBVar3;
  U32 UVar4;
  size_t sVar5;
  size_t sVar6;
  size_t lgHash;
  size_t smHash;
  U32 i;
  U32 current;
  U32 fastHashFillStep;
  BYTE *iend;
  BYTE *ip;
  BYTE *base;
  U32 hBitsS;
  U32 *hashSmall;
  U32 mls;
  U32 hBitsL;
  U32 *hashLarge;
  ZSTD_compressionParameters *cParams;
  ZSTD_dictTableLoadMethod_e dtlm_local;
  void *end_local;
  ZSTD_matchState_t *ms_local;
  
  pUVar1 = ms->hashTable;
  hBits = (ms->cParams).hashLog;
  mls_00 = (ms->cParams).minMatch;
  pUVar2 = ms->chainTable;
  hBits_00 = (ms->cParams).chainLog;
  pBVar3 = (ms->window).base;
  iend = pBVar3 + ms->nextToUpdate;
  do {
    if ((BYTE *)((long)end - 8U) < iend + 2) {
      return;
    }
    UVar4 = (int)iend - (int)pBVar3;
    for (smHash._4_4_ = 0; smHash._4_4_ < 3; smHash._4_4_ = smHash._4_4_ + 1) {
      sVar5 = ZSTD_hashPtr(iend + smHash._4_4_,hBits_00,mls_00);
      sVar6 = ZSTD_hashPtr(iend + smHash._4_4_,hBits,8);
      if (smHash._4_4_ == 0) {
        pUVar2[sVar5] = UVar4;
LAB_00701c6f:
        pUVar1[sVar6] = UVar4 + smHash._4_4_;
      }
      else if (pUVar1[sVar6] == 0) goto LAB_00701c6f;
      if (dtlm == ZSTD_dtlm_fast) break;
    }
    iend = iend + 3;
  } while( true );
}

Assistant:

void ZSTD_fillDoubleHashTable(ZSTD_matchState_t* ms,
                              void const* end, ZSTD_dictTableLoadMethod_e dtlm)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashLarge = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32  const mls = cParams->minMatch;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const base = ms->window.base;
    const BYTE* ip = base + ms->nextToUpdate;
    const BYTE* const iend = ((const BYTE*)end) - HASH_READ_SIZE;
    const U32 fastHashFillStep = 3;

    /* Always insert every fastHashFillStep position into the hash tables.
     * Insert the other positions into the large hash table if their entry
     * is empty.
     */
    for (; ip + fastHashFillStep - 1 <= iend; ip += fastHashFillStep) {
        U32 const current = (U32)(ip - base);
        U32 i;
        for (i = 0; i < fastHashFillStep; ++i) {
            size_t const smHash = ZSTD_hashPtr(ip + i, hBitsS, mls);
            size_t const lgHash = ZSTD_hashPtr(ip + i, hBitsL, 8);
            if (i == 0)
                hashSmall[smHash] = current + i;
            if (i == 0 || hashLarge[lgHash] == 0)
                hashLarge[lgHash] = current + i;
            /* Only load extra positions for ZSTD_dtlm_full */
            if (dtlm == ZSTD_dtlm_fast)
                break;
        }
    }
}